

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped *
glslang::TIntermediate::traverseLValueBase
          (TIntermTyped *node,bool swizzleOkay,bool bufferReferenceOk,
          function<bool_(const_TIntermNode_&)> *proc)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  ulong uVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TOperator op;
  TIntermBinary *binary;
  function<bool_(const_TIntermNode_&)> *proc_local;
  bool bufferReferenceOk_local;
  TIntermTyped *pTStack_18;
  bool swizzleOkay_local;
  TIntermTyped *node_local;
  TIntermOperator *this;
  
  pTStack_18 = node;
  do {
    iVar2 = (*(pTStack_18->super_TIntermNode)._vptr_TIntermNode[0x14])();
    this = (TIntermOperator *)CONCAT44(extraout_var,iVar2);
    if (this == (TIntermOperator *)0x0) {
      bVar1 = std::function::operator_cast_to_bool((function *)proc);
      if (bVar1) {
        std::function<bool_(const_TIntermNode_&)>::operator()(proc,&pTStack_18->super_TIntermNode);
      }
      return pTStack_18;
    }
    TVar3 = TIntermOperator::getOp(this);
    if ((((TVar3 != EOpIndexDirect) && (TVar3 != EOpIndexIndirect)) &&
        (TVar3 != EOpIndexDirectStruct)) &&
       ((TVar3 != EOpVectorSwizzle && (TVar3 != EOpMatrixSwizzle)))) {
      return (TIntermTyped *)0x0;
    }
    if (!swizzleOkay) {
      if ((TVar3 == EOpVectorSwizzle) || (TVar3 == EOpMatrixSwizzle)) {
        return (TIntermTyped *)0x0;
      }
      if ((TVar3 == EOpIndexDirect) || (TVar3 == EOpIndexIndirect)) {
        iVar2 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xf0))();
        uVar5 = (**(code **)(*plVar4 + 0xd8))();
        if ((uVar5 & 1) == 0) {
          iVar2 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
          plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xf0))();
          uVar5 = (**(code **)(*plVar4 + 0xc0))();
          if ((uVar5 & 1) == 0) goto LAB_0074046e;
        }
        iVar2 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
        plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0xf0))();
        uVar5 = (**(code **)(*plVar4 + 0xe8))();
        if ((uVar5 & 1) == 0) {
          return (TIntermTyped *)0x0;
        }
      }
    }
LAB_0074046e:
    bVar1 = std::function::operator_cast_to_bool((function *)proc);
    if ((bVar1) &&
       (bVar1 = std::function<bool_(const_TIntermNode_&)>::operator()
                          (proc,&pTStack_18->super_TIntermNode), !bVar1)) {
      return pTStack_18;
    }
    iVar2 = (*(this->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    pTStack_18 = (TIntermTyped *)CONCAT44(extraout_var_03,iVar2);
    if ((bufferReferenceOk) && (bVar1 = TIntermTyped::isReference(pTStack_18), bVar1)) {
      return pTStack_18;
    }
  } while( true );
}

Assistant:

const TIntermTyped* TIntermediate::traverseLValueBase(const TIntermTyped* node, bool swizzleOkay,
                                                      bool bufferReferenceOk,
                                                      std::function<bool(const TIntermNode&)> proc)
{
    do {
        const TIntermBinary* binary = node->getAsBinaryNode();
        if (binary == nullptr) {
            if (proc) {
                proc(*node);
            }
            return node;
        }
        TOperator op = binary->getOp();
        if (op != EOpIndexDirect && op != EOpIndexIndirect && op != EOpIndexDirectStruct && op != EOpVectorSwizzle &&
            op != EOpMatrixSwizzle)
            return nullptr;
        if (!swizzleOkay) {
            if (op == EOpVectorSwizzle || op == EOpMatrixSwizzle)
                return nullptr;
            if ((op == EOpIndexDirect || op == EOpIndexIndirect) &&
                (binary->getLeft()->getType().isVector() || binary->getLeft()->getType().isScalar()) &&
                !binary->getLeft()->getType().isArray())
                return nullptr;
        }
        if (proc) {
            if (!proc(*node)) {
                return node;
            }
        }
        node = binary->getLeft();
        if (bufferReferenceOk && node->isReference())
            return node;
    } while (true);
}